

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu.c
# Opt level: O2

MPP_RET vdpu_av1d_deinit(void *hal)

{
  int iVar1;
  VdpuAv1dRegCtx *ctx;
  void *ptr;
  MPP_RET MVar2;
  ulong uVar3;
  
  ctx = *(VdpuAv1dRegCtx **)((long)hal + 0x50);
  iVar1 = *(int *)((long)hal + 0x58);
  for (uVar3 = 0; ((ulong)(iVar1 != 0) << 5 | 0x10) != uVar3; uVar3 = uVar3 + 0x10) {
    ptr = *(void **)((long)&ctx->reg_buf[0].regs + uVar3);
    if (ptr != (void *)0x0) {
      mpp_osal_free("hal_av1d_release_res",ptr);
    }
    *(undefined8 *)((long)&ctx->reg_buf[0].regs + uVar3) = 0;
  }
  if (ctx->prob_tbl_base != (MppBuffer)0x0) {
    MVar2 = mpp_buffer_put_with_caller(ctx->prob_tbl_base,"hal_av1d_release_res");
    if (MVar2 != MPP_OK) {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf2);
      }
      if ((hal_av1d_debug & 2) != 0) {
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",0xf2);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0020ab0e;
      }
    }
  }
  if (ctx->prob_tbl_out_base != (MppBuffer)0x0) {
    MVar2 = mpp_buffer_put_with_caller(ctx->prob_tbl_out_base,"hal_av1d_release_res");
    if (MVar2 != MPP_OK) {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf3);
      }
      if ((hal_av1d_debug & 2) != 0) {
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",0xf3);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0020ab0e;
      }
    }
  }
  if (ctx->tile_info != (MppBuffer)0x0) {
    MVar2 = mpp_buffer_put_with_caller(ctx->tile_info,"hal_av1d_release_res");
    if (MVar2 != MPP_OK) {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf4);
      }
      if ((hal_av1d_debug & 2) != 0) {
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",0xf4);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0020ab0e;
      }
    }
  }
  if (ctx->film_grain_mem != (MppBuffer)0x0) {
    MVar2 = mpp_buffer_put_with_caller(ctx->film_grain_mem,"hal_av1d_release_res");
    if (MVar2 != MPP_OK) {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf5);
      }
      if ((hal_av1d_debug & 2) != 0) {
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",0xf5);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0020ab0e;
      }
    }
  }
  if (ctx->global_model != (MppBuffer)0x0) {
    MVar2 = mpp_buffer_put_with_caller(ctx->global_model,"hal_av1d_release_res");
    if (MVar2 != MPP_OK) {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf6);
      }
      if ((hal_av1d_debug & 2) != 0) {
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",0xf6);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0020ab0e;
      }
    }
  }
  if (ctx->tile_buf != (MppBuffer)0x0) {
    MVar2 = mpp_buffer_put_with_caller(ctx->tile_buf,"hal_av1d_release_res");
    if (MVar2 != MPP_OK) {
      if ((hal_av1d_debug & 1) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buffer put error(%d).\n",(char *)0x0,0xf7);
      }
      if ((hal_av1d_debug & 2) != 0) {
        _mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                   "hal_av1d_release_res",0xf7);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0020ab0e:
          abort();
        }
      }
    }
  }
  vdpu_av1d_filtermem_release(ctx);
  hal_bufs_deinit(ctx->tile_out_bufs);
  if (*(void **)((long)hal + 0x50) != (void *)0x0) {
    mpp_osal_free("hal_av1d_release_res",*(void **)((long)hal + 0x50));
  }
  *(undefined8 *)((long)hal + 0x50) = 0;
  return MPP_OK;
}

Assistant:

MPP_RET vdpu_av1d_deinit(void *hal)
{
    hal_av1d_release_res(hal);

    return MPP_OK;
}